

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O3

void duckdb::DisabledOptimizersSetting::SetGlobal
               (DatabaseInstance *db,DBConfig *config,Value *input)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  DBConfig *pDVar2;
  pointer str;
  set<duckdb::OptimizerType,_std::less<duckdb::OptimizerType>,_std::allocator<duckdb::OptimizerType>_>
  disabled_optimizers;
  string param;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true> list
  ;
  OptimizerType local_a4;
  undefined1 local_a0 [32];
  _Base_ptr p_Stack_80;
  size_t local_78;
  string local_70;
  DBConfig *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_48;
  
  local_50 = config;
  Value::ToString_abi_cxx11_((string *)local_a0,input);
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,",","");
  StringUtil::Split(&local_48,(string *)local_a0,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
    operator_delete((void *)local_a0._0_8_);
  }
  local_a0._24_8_ = local_a0 + 8;
  local_a0._8_4_ = _S_red;
  local_a0._16_8_ = (_Base_ptr)0x0;
  local_78 = 0;
  p_Stack_80 = (_Base_ptr)local_a0._24_8_;
  if (local_48.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    str = local_48.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    do {
      StringUtil::Lower(&local_70,(string *)str);
      StringUtil::Trim(&local_70);
      if (local_70._M_string_length != 0) {
        local_a4 = OptimizerTypeFromString((string *)&local_70);
        ::std::
        _Rb_tree<duckdb::OptimizerType,_duckdb::OptimizerType,_std::_Identity<duckdb::OptimizerType>,_std::less<duckdb::OptimizerType>,_std::allocator<duckdb::OptimizerType>_>
        ::_M_insert_unique<duckdb::OptimizerType>
                  ((_Rb_tree<duckdb::OptimizerType,_duckdb::OptimizerType,_std::_Identity<duckdb::OptimizerType>,_std::less<duckdb::OptimizerType>,_std::allocator<duckdb::OptimizerType>_>
                    *)local_a0,&local_a4);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      str = (pointer)((string *)str + 1);
    } while (str != local_48.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  }
  pDVar2 = local_50;
  ::std::
  _Rb_tree<duckdb::OptimizerType,_duckdb::OptimizerType,_std::_Identity<duckdb::OptimizerType>,_std::less<duckdb::OptimizerType>,_std::allocator<duckdb::OptimizerType>_>
  ::clear(&(local_50->options).disabled_optimizers._M_t);
  if ((_Base_ptr)local_a0._16_8_ != (_Base_ptr)0x0) {
    (pDVar2->options).disabled_optimizers._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_a0._8_4_;
    (pDVar2->options).disabled_optimizers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)local_a0._16_8_;
    (pDVar2->options).disabled_optimizers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)local_a0._24_8_;
    (pDVar2->options).disabled_optimizers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         p_Stack_80;
    *(_Rb_tree_header **)(local_a0._16_8_ + 8) =
         &(pDVar2->options).disabled_optimizers._M_t._M_impl.super__Rb_tree_header;
    (pDVar2->options).disabled_optimizers._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_78;
    local_a0._16_8_ = (_Base_ptr)0x0;
    local_a0._24_8_ = local_a0 + 8;
    local_78 = 0;
    p_Stack_80 = (_Base_ptr)local_a0._24_8_;
  }
  ::std::
  _Rb_tree<duckdb::OptimizerType,_duckdb::OptimizerType,_std::_Identity<duckdb::OptimizerType>,_std::less<duckdb::OptimizerType>,_std::allocator<duckdb::OptimizerType>_>
  ::~_Rb_tree((_Rb_tree<duckdb::OptimizerType,_duckdb::OptimizerType,_std::_Identity<duckdb::OptimizerType>,_std::less<duckdb::OptimizerType>,_std::allocator<duckdb::OptimizerType>_>
               *)local_a0);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_48);
  return;
}

Assistant:

void DisabledOptimizersSetting::SetGlobal(DatabaseInstance *db, DBConfig &config, const Value &input) {
	auto list = StringUtil::Split(input.ToString(), ",");
	set<OptimizerType> disabled_optimizers;
	for (auto &entry : list) {
		auto param = StringUtil::Lower(entry);
		StringUtil::Trim(param);
		if (param.empty()) {
			continue;
		}
		disabled_optimizers.insert(OptimizerTypeFromString(param));
	}
	config.options.disabled_optimizers = std::move(disabled_optimizers);
}